

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O2

void __thiscall
QPicturePaintEngine::writeCmdLength(QPicturePaintEngine *this,int pos,QRectF *r,bool corr)

{
  QPaintEnginePrivate *this_00;
  QPaintEnginePrivate *pQVar1;
  long lVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  bool bVar7;
  int iVar8;
  QByteArray *this_01;
  char *pcVar9;
  QPainter *pQVar10;
  QPen *this_02;
  QTransform *this_03;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long in_FS_OFFSET;
  int iVar15;
  double dVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  ulong uVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  double dStack_a0;
  double dStack_80;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngine).d_ptr.d;
  iVar8 = QBuffer::pos();
  uVar14 = iVar8 - pos;
  local_58.xp = r->xp;
  local_58.yp = r->yp;
  local_58.w = r->w;
  local_58.h = r->h;
  if ((int)uVar14 < 0xff) {
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)(pQVar1 + 1),(int)(char)uVar14);
  }
  else {
    this_00 = pQVar1 + 1;
    QDataStream::operator<<((QDataStream *)this_00,0);
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)this_00,0xffffffffffffffff);
    this_01 = (QByteArray *)QBuffer::buffer();
    pcVar9 = QByteArray::data(this_01);
    memmove(pcVar9 + (long)pos + 4,pcVar9 + pos,(ulong)uVar14);
    QDataStream::operator<<((QDataStream *)this_00,uVar14);
  }
  QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
  qVar4 = local_58.h;
  qVar3 = local_58.w;
  if ((local_58.w <= 0.0) && (local_58.h <= 0.0)) goto LAB_00287b66;
  if (corr) {
    pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
    this_02 = QPainter::pen(pQVar10);
    iVar8 = QPen::width(this_02);
    dVar16 = (double)(iVar8 / 2);
    dVar23 = qVar3 + local_58.xp;
    dVar25 = qVar4 + local_58.yp;
    local_58.xp = local_58.xp - dVar16;
    local_58.yp = local_58.yp - dVar16;
    local_58.w = (dVar23 + dVar16) - local_58.xp;
    local_58.h = (dVar25 + dVar16) - local_58.yp;
  }
  pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
  this_03 = QPainter::transform(pQVar10);
  QTransform::mapRect(&local_78,this_03,&local_58);
  local_58.xp = (qreal)CONCAT44(local_78.xp._4_4_,local_78.xp._0_4_);
  local_58.yp = (qreal)CONCAT44(local_78.yp._4_4_,local_78.yp._0_4_);
  local_58.w = (qreal)CONCAT44(local_78.w._4_4_,local_78.w._0_4_);
  local_58.h = (qreal)CONCAT44(local_78.h._4_4_,local_78.h._0_4_);
  pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
  bVar7 = QPainter::hasClipping(pQVar10);
  if (bVar7) {
    local_78.w._0_4_ = 0xffffffff;
    local_78.w._4_4_ = 0xffffffff;
    local_78.h._0_4_ = 0xffffffff;
    local_78.h._4_4_ = 0xffffffff;
    local_78.xp._0_4_ = 0xffffffff;
    local_78.xp._4_4_ = 0xffffffff;
    local_78.yp._0_4_ = 0xffffffff;
    local_78.yp._4_4_ = 0xffffffff;
    pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
    QPainter::clipBoundingRect(&local_78,pQVar10);
    QRectF::operator&=(&local_58,&local_78);
  }
  qVar6 = local_58.h;
  qVar5 = local_58.w;
  qVar4 = local_58.yp;
  qVar3 = local_58.xp;
  if ((local_58.w <= 0.0) && (local_58.h <= 0.0)) goto LAB_00287b66;
  auVar18._8_8_ = local_58.yp;
  auVar18._0_8_ = local_58.xp;
  auVar18 = minpd(_DAT_005c3790,auVar18);
  auVar18 = maxpd(auVar18,_DAT_005c37a0);
  dVar16 = floor(auVar18._0_8_);
  dStack_80 = auVar18._8_8_;
  dVar23 = floor(dStack_80);
  iVar15 = (int)dVar16;
  iVar20 = (int)dVar23;
  auVar22._0_8_ = qVar5 + qVar3;
  auVar22._8_8_ = qVar6 + qVar4;
  auVar18 = minpd(_DAT_005c3790,auVar22);
  auVar18 = maxpd(auVar18,_DAT_005c37a0);
  dVar16 = ceil(auVar18._0_8_);
  dStack_a0 = auVar18._8_8_;
  dVar23 = ceil(dStack_a0);
  auVar19._0_4_ = (int)dVar16;
  auVar19._4_4_ = (int)dVar23;
  auVar19._8_8_ = 0;
  lVar2 = *(long *)&pQVar1[1].systemRect;
  iVar8 = *(int *)(lVar2 + 0x28);
  iVar11 = *(int *)(lVar2 + 0x30) + 1;
  if (iVar11 - iVar8 < 1) {
    iVar13 = *(int *)(lVar2 + 0x2c);
    iVar12 = *(int *)(lVar2 + 0x34) + 1;
    if (0 < iVar12 - iVar13) goto LAB_00287b10;
    uVar17 = CONCAT44(auVar19._4_4_ + -1,auVar19._0_4_ + -1);
    uVar21 = CONCAT44(iVar20,iVar15);
  }
  else {
    iVar13 = *(int *)(lVar2 + 0x2c);
    iVar12 = *(int *)(lVar2 + 0x34) + 1;
LAB_00287b10:
    uVar21 = CONCAT44(-(uint)(iVar13 < iVar20),-(uint)(iVar8 < iVar15));
    uVar21 = ~uVar21 & CONCAT44(iVar20,iVar15) | CONCAT44(iVar13,iVar8) & uVar21;
    auVar24._0_8_ = CONCAT44(-(uint)(auVar19._4_4_ < iVar12),-(uint)(auVar19._0_4_ < iVar11));
    auVar24._8_8_ = 0;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = CONCAT44(iVar12,iVar11) & auVar24._0_8_;
    auVar26 = ~auVar24 & auVar19 | auVar26;
    uVar17 = CONCAT44(auVar26._4_4_ + -1,auVar26._0_4_ + -1);
  }
  *(ulong *)(lVar2 + 0x28) = uVar21;
  *(undefined8 *)(lVar2 + 0x30) = uVar17;
LAB_00287b66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::writeCmdLength(int pos, const QRectF &r, bool corr)
{
    Q_D(QPicturePaintEngine);
    int newpos = d->pic_d->pictb.pos();            // new position
    int length = newpos - pos;
    QRectF br(r);

    if (length < 255) {                         // write 8-bit length
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)length;
    } else {                                    // write 32-bit length
        d->s << (quint32)0;                    // extend the buffer
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)255;                   // indicate 32-bit length
        char *p = d->pic_d->pictb.buffer().data();
        memmove(p+pos+4, p+pos, length);        // make room for 4 byte
        d->s << (quint32)length;
        newpos += 4;
    }
    d->pic_d->pictb.seek(newpos);                  // set to new position

    if (br.width() > 0.0 || br.height() > 0.0) {
        if (corr) {                             // widen bounding rect
            int w2 = painter()->pen().width() / 2;
            br.setCoords(br.left() - w2, br.top() - w2,
                         br.right() + w2, br.bottom() + w2);
        }
        br = painter()->transform().mapRect(br);
        if (painter()->hasClipping()) {
            QRectF cr = painter()->clipBoundingRect();
            br &= cr;
        }

        if (br.width() > 0.0 || br.height() > 0.0) {
            const auto clampToIntRange = [](qreal v)
            {
                return qBound(qreal((std::numeric_limits<int>::min)()),
                              v,
                              qreal((std::numeric_limits<int>::max)()));
            };
            int minx = qFloor(clampToIntRange(br.left()));
            int miny = qFloor(clampToIntRange(br.top()));
            int maxx = qCeil(clampToIntRange(br.right()));
            int maxy = qCeil(clampToIntRange(br.bottom()));

            if (d->pic_d->brect.width() > 0 || d->pic_d->brect.height() > 0) {
                minx = qMin(minx, d->pic_d->brect.left());
                miny = qMin(miny, d->pic_d->brect.top());
                maxx = qMax(maxx, d->pic_d->brect.x() + d->pic_d->brect.width());
                maxy = qMax(maxy, d->pic_d->brect.y() + d->pic_d->brect.height());
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            } else {
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            }
        }
    }
}